

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FFontChar2::MakeTexture(FFontChar2 *this)

{
  int iVar1;
  BYTE *pBVar2;
  bool bVar3;
  char local_ae [8];
  char name [9];
  BYTE color_2;
  int x_1;
  int y_1;
  BYTE color_1;
  SBYTE code;
  uint uStack_94;
  BYTE color;
  int x;
  int y;
  int dest_rew;
  int dest_adv;
  BYTE *dest_p;
  int iStack_78;
  BYTE setval;
  int setlen;
  int runlen;
  undefined1 local_68 [3];
  char local_65;
  byte local_62;
  BYTE buff [16];
  byte local_4d;
  undefined1 local_48 [2];
  bool rle;
  BYTE max;
  int destSize;
  FWadLump lump;
  FFontChar2 *this_local;
  
  lump.Lump = (FResourceLump *)this;
  FWadCollection::OpenLumpNum((FWadLump *)local_48,&Wads,*(int *)&(this->super_FTexture).field_0x54)
  ;
  iVar1 = (uint)(this->super_FTexture).Width * (uint)(this->super_FTexture).Height;
  local_4d = 0xff;
  bVar3 = true;
  FWadLump::Read((FWadLump *)local_48,local_68,4);
  if (local_65 == '2') {
    FWadLump::Read((FWadLump *)local_48,local_68,7);
    local_4d = local_62;
    FWadLump::Seek((FWadLump *)local_48,(long)(this->SourcePos + -0xb),1);
  }
  else {
    bVar3 = local_65 != '\x1a';
    if (bVar3) {
      FWadLump::Seek((FWadLump *)local_48,(long)(this->SourcePos + -4),1);
    }
    else {
      FWadLump::Read((FWadLump *)local_48,local_68,0xd);
      local_4d = buff[4] - 1;
      FWadLump::Seek((FWadLump *)local_48,(long)(this->SourcePos + -0x11),1);
    }
  }
  pBVar2 = (BYTE *)operator_new__((long)iVar1);
  this->Pixels = pBVar2;
  iStack_78 = 0;
  dest_p._4_4_ = 0;
  dest_p._3_1_ = 0;
  _dest_rew = this->Pixels;
  y = (int)(this->super_FTexture).Height;
  x = iVar1 + -1;
  if (bVar3) {
    for (uStack_94 = (uint)(this->super_FTexture).Height; uStack_94 != 0; uStack_94 = uStack_94 - 1)
    {
      y_1 = (int)(this->super_FTexture).Width;
      while (y_1 != 0) {
        if (iStack_78 == 0) {
          if (dest_p._4_4_ == 0) {
            FileReader::operator>>((FileReader *)local_48,(SBYTE *)((long)&x_1 + 2));
            if (x_1._2_1_ < '\0') {
              if (x_1._2_1_ != -0x80) {
                FileReader::operator>>((FileReader *)local_48,(BYTE *)((long)&x_1 + 1));
                dest_p._4_4_ = 1 - x_1._2_1_;
                dest_p._3_1_ = MIN<unsigned_char>(x_1._1_1_,local_4d);
                if (this->SourceRemap != (BYTE *)0x0) {
                  dest_p._3_1_ = this->SourceRemap[dest_p._3_1_];
                }
              }
            }
            else {
              iStack_78 = x_1._2_1_ + 1;
            }
          }
          else {
            *_dest_rew = dest_p._3_1_;
            _dest_rew = _dest_rew + y;
            y_1 = y_1 + -1;
            dest_p._4_4_ = dest_p._4_4_ + -1;
          }
        }
        else {
          FileReader::operator>>((FileReader *)local_48,(BYTE *)((long)&x_1 + 3));
          x_1._3_1_ = MIN<unsigned_char>(x_1._3_1_,local_4d);
          if (this->SourceRemap != (BYTE *)0x0) {
            x_1._3_1_ = this->SourceRemap[x_1._3_1_];
          }
          *_dest_rew = x_1._3_1_;
          _dest_rew = _dest_rew + y;
          y_1 = y_1 + -1;
          iStack_78 = iStack_78 + -1;
        }
      }
      _dest_rew = _dest_rew + -(long)x;
    }
  }
  else {
    for (register0x00000000 = (uint)(this->super_FTexture).Height; stack0xffffffffffffff60 != 0;
        register0x00000000 = stack0xffffffffffffff60 - 1) {
      for (name._2_4_ = ZEXT24((this->super_FTexture).Width); name._2_4_ != 0;
          name._2_4_ = name._2_4_ + -1) {
        FileReader::operator>>((FileReader *)local_48,(BYTE *)(name + 1));
        if (local_4d < (byte)name[1]) {
          name[1] = local_4d;
        }
        if (this->SourceRemap != (BYTE *)0x0) {
          name[1] = this->SourceRemap[(byte)name[1]];
        }
        *_dest_rew = name[1];
        _dest_rew = _dest_rew + y;
      }
      _dest_rew = _dest_rew + -(long)x;
    }
  }
  if (iVar1 < 0) {
    FWadCollection::GetLumpName(&Wads,local_ae,*(int *)&(this->super_FTexture).field_0x54);
    name[0] = '\0';
    I_FatalError("The font %s is corrupt",local_ae);
  }
  FWadLump::~FWadLump((FWadLump *)local_48);
  return;
}

Assistant:

void FFontChar2::MakeTexture ()
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	int destSize = Width * Height;
	BYTE max = 255;
	bool rle = true;

	// This is to "fix" bad fonts
	{
		BYTE buff[16];
		lump.Read (buff, 4);
		if (buff[3] == '2')
		{
			lump.Read (buff, 7);
			max = buff[6];
			lump.Seek (SourcePos - 11, SEEK_CUR);
		}
		else if (buff[3] == 0x1A)
		{
			lump.Read(buff, 13);
			max = buff[12] - 1;
			lump.Seek (SourcePos - 17, SEEK_CUR);
			rle = false;
		}
		else
		{
			lump.Seek (SourcePos - 4, SEEK_CUR);
		}
	}

	Pixels = new BYTE[destSize];

	int runlen = 0, setlen = 0;
	BYTE setval = 0;  // Shut up, GCC!
	BYTE *dest_p = Pixels;
	int dest_adv = Height;
	int dest_rew = destSize - 1;

	if (rle)
	{
		for (int y = Height; y != 0; --y)
		{
			for (int x = Width; x != 0; )
			{
				if (runlen != 0)
				{
					BYTE color;

					lump >> color;
					color = MIN (color, max);
					if (SourceRemap != NULL)
					{
						color = SourceRemap[color];
					}
					*dest_p = color;
					dest_p += dest_adv;
					x--;
					runlen--;
				}
				else if (setlen != 0)
				{
					*dest_p = setval;
					dest_p += dest_adv;
					x--;
					setlen--;
				}
				else
				{
					SBYTE code;

					lump >> code;
					if (code >= 0)
					{
						runlen = code + 1;
					}
					else if (code != -128)
					{
						BYTE color;

						lump >> color;
						setlen = (-code) + 1;
						setval = MIN (color, max);
						if (SourceRemap != NULL)
						{
							setval = SourceRemap[setval];
						}
					}
				}
			}
			dest_p -= dest_rew;
		}
	}
	else
	{
		for (int y = Height; y != 0; --y)
		{
			for (int x = Width; x != 0; --x)
			{
				BYTE color;
				lump >> color;
				if (color > max)
				{
					color = max;
				}
				if (SourceRemap != NULL)
				{
					color = SourceRemap[color];
				}
				*dest_p = color;
				dest_p += dest_adv;
			}
			dest_p -= dest_rew;
		}
	}

	if (destSize < 0)
	{
		char name[9];
		Wads.GetLumpName (name, SourceLump);
		name[8] = 0;
		I_FatalError ("The font %s is corrupt", name);
	}
}